

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  undefined1 auVar4 [16];
  double dVar5;
  bool bVar6;
  __mode_t __mode;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  _func_void_uv__work_ptr *p_Var13;
  ssize_t sVar14;
  size_t sVar15;
  _func_void_uv__work_ptr *__buf;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  uv_loop_s *puVar19;
  uint uVar20;
  _func_void_uv__work_ptr_int *p_Var21;
  long lVar22;
  size_t sVar23;
  iovec *iov;
  code *pcVar24;
  _func_void_uv__work_ptr_int *p_Var25;
  size_t sVar26;
  _func_void_uv__work_ptr_int *p_Var27;
  pollfd pfd;
  stat pbuf;
  _func_void_uv__work_ptr_int *local_2118;
  _func_void_uv__work_ptr_int *local_20d0;
  stat local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  undefined8 local_2020;
  __gid_t _Stack_2018;
  uv_loop_s *local_2010;
  void *local_2008;
  _func_void_uv__work_ptr *p_Stack_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *p_Stack_1fc8;
  char *local_1f28;
  int local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar12 = (uint *)__errno_location();
LAB_00496acb:
  *puVar12 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    if (uv__fs_open_no_cloexec_support != '\0') {
LAB_00496b28:
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar8 = open((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1));
      if (-1 < iVar8) {
        iVar11 = uv__cloexec_ioctl(iVar8,1);
        if (iVar11 != 0) {
          iVar11 = uv__close(iVar8);
          iVar8 = -1;
          if (iVar11 != 0) {
switchD_00496aeb_default:
            abort();
          }
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_004974f5:
      p_Var27 = (_func_void_uv__work_ptr_int *)(long)iVar8;
      goto LAB_004972e1;
    }
    uVar10 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                  (ulong)*(uint *)(w[-2].wq + 1));
    if ((int)uVar10 < 0) {
      if (*puVar12 != 0x16) break;
      uv__fs_open_no_cloexec_support = '\x01';
      goto LAB_00496b28;
    }
    p_Var27 = (_func_void_uv__work_ptr_int *)(ulong)uVar10;
    goto LAB_004977c4;
  case 2:
    uVar10 = close(*(int *)w[-2].wq);
    break;
  case 3:
    uVar7 = uv__getiovmax();
    uVar10 = *(uint *)((long)w[-2].wq + 0xc);
    if (uVar7 < uVar10) {
      *(uint *)((long)w[-2].wq + 0xc) = uVar7;
      uVar10 = uVar7;
    }
    p_Var27 = w[-1].done;
    if ((long)p_Var27 < 0) {
      piVar2 = (iovec *)w[-1].work;
      if (uVar10 == 1) {
        p_Var27 = (_func_void_uv__work_ptr_int *)
                  read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
      }
      else {
        p_Var27 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar10);
      }
    }
    else {
      if ((uVar10 != 1) && (uv__fs_read_no_preadv != '\x01')) {
        p_Var27 = (_func_void_uv__work_ptr_int *)
                  uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar10,(int64_t)p_Var27);
        if ((p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
           (p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar12 != 0x26))
        goto LAB_00497690;
        uv__fs_read_no_preadv = '\x01';
        p_Var27 = w[-1].done;
      }
      p_Var27 = (_func_void_uv__work_ptr_int *)
                pread(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                      (__off_t)p_Var27);
    }
LAB_00497690:
    if ((uv__work *)w[-1].work != w + 1) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_004972e1;
  case 4:
    uVar7 = uv__getiovmax();
    uVar10 = *(uint *)((long)w[-2].wq + 0xc);
    ptr = (uv__work *)w[-1].work;
    if (uVar10 != 0) {
      p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00496e27:
      uVar20 = uVar7;
      if (uVar10 < uVar7) {
        uVar20 = uVar10;
      }
      *(uint *)((long)w[-2].wq + 0xc) = uVar20;
      do {
        p_Var21 = w[-1].done;
        if ((long)p_Var21 < 0) {
          piVar2 = (iovec *)w[-1].work;
          if (uVar20 == 1) {
            p_Var21 = (_func_void_uv__work_ptr_int *)
                      write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
          }
          else {
            p_Var21 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar20);
          }
LAB_00496e94:
          if (-1 < (long)p_Var21) goto LAB_00496eca;
          uVar20 = *puVar12;
        }
        else {
          iov = (iovec *)w[-1].work;
          if ((uVar20 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_00496e4e:
            p_Var21 = (_func_void_uv__work_ptr_int *)
                      pwrite(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off_t)p_Var21);
            goto LAB_00496e94;
          }
          p_Var21 = (_func_void_uv__work_ptr_int *)
                    uv__pwritev(*(int *)w[-2].wq,iov,uVar20,(int64_t)p_Var21);
          if (p_Var21 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_00496e94;
          uVar20 = *puVar12;
          p_Var21 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          if (uVar20 == 0x26) {
            uv__fs_write_no_pwritev = '\x01';
            iov = (iovec *)w[-1].work;
            p_Var21 = w[-1].done;
            goto LAB_00496e4e;
          }
        }
        if (uVar20 != 4) goto LAB_00497745;
        uVar20 = *(uint *)((long)w[-2].wq + 0xc);
      } while( true );
    }
    p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0049774c:
    if (ptr != w + 1) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_004972e1;
  case 5:
    local_20d0 = w[-1].done;
    sVar14 = sendfile(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(off_t *)&local_20d0,
                      (size_t)w[1].done);
    local_2118 = w[-1].done;
    if ((local_20d0 + -(long)local_2118 == (_func_void_uv__work_ptr_int *)0x0 ||
        (long)local_20d0 < (long)local_2118) && sVar14 == -1) {
      uVar10 = *puVar12;
      if (((uVar10 < 0x17) && ((0x440020U >> (uVar10 & 0x1f) & 1) != 0)) ||
         (p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar10 == 0x58)) {
        *puVar12 = 0;
        p_Var27 = w[1].done;
        if (p_Var27 != (_func_void_uv__work_ptr_int *)0x0) {
          iVar8 = *(int *)w[-2].wq;
          iVar11 = *(int *)((long)w[-2].wq + 4);
          bVar6 = true;
          p_Var21 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00497350:
          do {
            sVar23 = (long)p_Var27 - (long)p_Var21;
            if (0x1fff < sVar23) {
              sVar23 = 0x2000;
            }
LAB_00497367:
            if (bVar6) {
              sVar18 = pread(iVar11,local_2038,sVar23,(__off_t)local_2118);
            }
            else {
              sVar18 = read(iVar11,local_2038,sVar23);
            }
            if (sVar18 == 0xffffffffffffffff) goto code_r0x00497394;
            if (sVar18 == 0) goto LAB_004976f6;
            if (0 < (long)sVar18) {
              lVar22 = 0;
              sVar23 = sVar18;
              do {
                while( true ) {
                  sVar14 = write(iVar8,local_2038 + lVar22,sVar23);
                  if (sVar14 != -1) break;
                  if (*puVar12 != 4) {
                    if (*puVar12 != 0xb) goto LAB_00497724;
                    local_20c8.st_dev._4_4_ = 4;
                    local_20c8.st_dev._0_4_ = iVar8;
                    while( true ) {
                      iVar9 = poll((pollfd *)&local_20c8,1,-1);
                      if (iVar9 != -1) break;
                      if (*puVar12 != 4) goto LAB_0049771d;
                    }
                    if ((local_20c8.st_dev._4_4_ & 0xfffb0000) != 0) {
LAB_0049771d:
                      *puVar12 = 5;
                      goto LAB_00497724;
                    }
                  }
                }
                lVar22 = lVar22 + sVar14;
                sVar23 = sVar18 - lVar22;
              } while (sVar23 != 0 && lVar22 <= (long)sVar18);
            }
            local_2118 = local_2118 + sVar18;
            p_Var21 = p_Var21 + sVar18;
            if (p_Var27 <= p_Var21) {
LAB_004976f6:
              if (p_Var21 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_00497701;
              p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
              goto LAB_004972e1;
            }
          } while( true );
        }
        p_Var21 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00497701:
        w[-1].done = local_2118;
        p_Var27 = p_Var21;
      }
    }
    else {
      w[-1].done = local_20d0;
      p_Var27 = local_20d0 + -(long)local_2118;
    }
    goto LAB_004972e1;
  case 6:
    uVar10 = stat((char *)w[-6].done,(stat *)local_2038);
    goto LAB_00497007;
  case 7:
    uVar10 = lstat((char *)w[-6].done,(stat *)local_2038);
    goto LAB_00497007;
  case 8:
    uVar10 = fstat(*(int *)w[-2].wq,(stat *)local_2038);
LAB_00497007:
    if (uVar10 == 0) {
      w[-6].loop = (uv_loop_s *)local_2038._0_8_;
      w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
      w[-6].wq[1] = local_2028;
      auVar4._8_4_ = _Stack_2018;
      auVar4._0_8_ = (ulong)local_2020 >> 0x20;
      auVar4._12_4_ = 0;
      w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
      w[-5].done = (_func_void_uv__work_ptr_int *)auVar4._8_8_;
      w[-5].loop = local_2010;
      w[-5].wq[0] = (void *)local_2038._8_8_;
      w[-5].wq[1] = local_2008;
      w[-4].work = p_Stack_2000;
      w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
      w[-4].wq[1] = local_1ff0;
      w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
      w[-3].done = local_1fe0;
      w[-3].loop = puStack_1fd8;
      w[-2].work = local_1fd0;
      w[-2].done = p_Stack_1fc8;
      w[-3].wq[0] = local_1fd0;
      w[-3].wq[1] = p_Stack_1fc8;
      w[-4].loop = (uv_loop_s *)0x0;
      w[-4].wq[0] = (void *)0x0;
    }
    break;
  case 9:
    uVar10 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
    break;
  case 10:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar5 = (double)w[-1].wq[0] * 1000000.0;
    uVar16 = (ulong)dVar5;
    local_2038._8_8_ =
         (((long)(dVar5 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar5 = (double)w[-1].wq[1] * 1000000.0;
    uVar16 = (ulong)dVar5;
    local_2020 = (void *)((((long)(dVar5 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                          1000000) * 1000);
    uVar10 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
    break;
  case 0xb:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar5 = (double)w[-1].wq[0] * 1000000.0;
    uVar16 = (ulong)dVar5;
    local_2038._8_8_ =
         (((long)(dVar5 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar5 = (double)w[-1].wq[1] * 1000000.0;
    uVar16 = (ulong)dVar5;
    local_2020 = (void *)((((long)(dVar5 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                          1000000) * 1000);
    uVar10 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
    break;
  case 0xc:
    uVar10 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    uVar10 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    uVar10 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    uVar10 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    uVar10 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    uVar10 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    uVar10 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    uVar10 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar17 = mkdtemp((char *)w[-6].done);
    p_Var27 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar17 == (char *)0x0);
    goto LAB_004972e1;
  case 0x15:
    uVar10 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038._0_8_ = (uv_loop_s *)0x0;
    iVar8 = scandir((char *)w[-6].done,(dirent ***)local_2038,uv__fs_scandir_filter,
                    uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar8 != -1) {
      puVar19 = (uv_loop_s *)local_2038._0_8_;
      if (iVar8 == 0) {
        free((void *)local_2038._0_8_);
        puVar19 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar19;
      goto LAB_004974f5;
    }
LAB_00497674:
    p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_004972e1;
  case 0x17:
    uVar10 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    uVar10 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar15 = pathconf((char *)w[-6].done,4);
    sVar26 = 0x100;
    if (sVar15 != 0xffffffffffffffff) {
      sVar26 = sVar15;
    }
    __buf = (_func_void_uv__work_ptr *)uv__malloc(sVar26);
    if (__buf == (_func_void_uv__work_ptr *)0x0) {
      *puVar12 = 0xc;
    }
    else {
      sVar15 = readlink((char *)w[-6].done,(char *)__buf,sVar26);
      if (sVar15 != 0xffffffffffffffff) {
        p_Var13 = __buf;
        if (sVar15 == sVar26) {
          p_Var13 = (_func_void_uv__work_ptr *)uv__realloc(__buf,sVar26 + 1);
          sVar15 = sVar26;
          if (p_Var13 == (_func_void_uv__work_ptr *)0x0) goto LAB_00496daa;
        }
        p_Var13[sVar15] = (_func_void_uv__work_ptr)0x0;
        goto LAB_00497809;
      }
LAB_00496daa:
      uv__free(__buf);
    }
    goto LAB_004972eb;
  case 0x1a:
    uVar10 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    uVar10 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var13 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var13 != (_func_void_uv__work_ptr *)0x0) {
LAB_00497809:
      w[-6].work = p_Var13;
      w[-7].wq[1] = (void *)0x0;
      goto LAB_004977d0;
    }
    goto LAB_004972eb;
  case 0x1d:
    uVar10 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0)
    ;
    uv_fs_req_cleanup((uv_fs_t *)local_2038);
    if ((int)uVar10 < 0) {
      p_Var27 = (_func_void_uv__work_ptr_int *)(long)(int)uVar10;
    }
    else {
      iVar8 = fstat(uVar10,&local_20c8);
      __mode = local_20c8.st_mode;
      iVar11 = -1;
      if (iVar8 == 0) {
        iVar11 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                            (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_20c8.st_mode,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        iVar8 = iVar11;
        if (-1 < iVar11) {
          iVar8 = fchmod(iVar11,__mode);
          if (iVar8 == -1) goto LAB_00497248;
          if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_004975a5:
            if (local_20c8.st_size == 0) {
              iVar8 = 0;
            }
            else {
              p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
              sVar26 = local_20c8.st_size;
              do {
                local_2038._8_4_ = 6;
                local_1ff8 = UV_FS_SENDFILE;
                local_1f28 = (char *)0x0;
                local_1f10 = (uv_buf_t *)0x0;
                local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                puStack_1fd8 = (uv_loop_s *)0x0;
                local_1ff0 = (uv_loop_t *)0x0;
                p_Stack_1fe8 = (uv_fs_cb)0x0;
                local_1f20 = iVar11;
                local_1f1c = uVar10;
                local_1f08 = p_Var27;
                local_1eb8 = sVar26;
                uv__fs_work(&local_1ee8);
                iVar8 = (int)local_1fe0;
                uv_fs_req_cleanup((uv_fs_t *)local_2038);
                if (iVar8 < 0) goto LAB_00497258;
                p_Var27 = p_Var27 + (long)local_1fe0;
                sVar26 = sVar26 - (long)local_1fe0;
              } while (sVar26 != 0);
              iVar8 = 0;
            }
          }
          else {
            iVar9 = ioctl(iVar11,0x40049409,(ulong)uVar10);
            iVar8 = 0;
            if (iVar9 == -1) {
              uVar7 = *puVar12;
              if (((uVar7 != 0x12) && (uVar7 != 0x5f)) && (uVar7 != 0x19)) goto LAB_0049724b;
              iVar8 = -0x5f;
              if (((ulong)w[-2].wq[0] & 0x400000000) == 0) goto LAB_004975a5;
            }
          }
        }
      }
      else {
LAB_00497248:
        uVar7 = *puVar12;
LAB_0049724b:
        iVar8 = 0;
        if (0 < (int)uVar7) {
          iVar8 = -uVar7;
        }
      }
LAB_00497258:
      iVar9 = uv__close_nocheckstdio(uVar10);
      if (iVar9 == 0) {
        iVar9 = iVar8;
      }
      if (iVar8 != 0) {
        iVar9 = iVar8;
      }
      if (iVar11 < 0) {
        if (iVar9 != 0) goto LAB_0049766f;
      }
      else {
        iVar8 = uv__close_nocheckstdio(iVar11);
        if (iVar8 == 0) {
          iVar8 = iVar9;
        }
        if (iVar9 == 0) {
          iVar9 = iVar8;
        }
        if (iVar9 != 0) {
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
LAB_0049766f:
          *puVar12 = -iVar9;
          goto LAB_00497674;
        }
      }
      p_Var27 = (_func_void_uv__work_ptr_int *)0x0;
    }
    goto LAB_004972e1;
  case 0x1e:
    uVar10 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  default:
    goto switchD_00496aeb_default;
  }
  p_Var27 = (_func_void_uv__work_ptr_int *)(long)(int)uVar10;
  goto LAB_004972e1;
code_r0x00497394:
  uVar10 = *puVar12;
  if (uVar10 != 4) goto code_r0x0049739c;
  goto LAB_00497367;
code_r0x0049739c:
  if ((!bVar6) || (p_Var21 != (_func_void_uv__work_ptr_int *)0x0)) {
    p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (p_Var21 + 1 < (code *)0x2) goto LAB_004972e1;
    goto LAB_00497701;
  }
  bVar6 = false;
  p_Var21 = (_func_void_uv__work_ptr_int *)0x0;
  if ((uVar10 == 5) || (p_Var21 = (_func_void_uv__work_ptr_int *)0x0, uVar10 == 0x1d))
  goto LAB_00497350;
LAB_00497724:
  p_Var27 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_004972e1:
  if (p_Var27 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_004977c4:
    w[-7].wq[1] = p_Var27;
    if (p_Var27 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_004977d0:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
    return;
  }
LAB_004972eb:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar12 != 4)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar12;
    return;
  }
  goto LAB_00496acb;
LAB_00496eca:
  if (p_Var21 == (_func_void_uv__work_ptr_int *)0x0) {
    p_Var21 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00497745:
    if (p_Var27 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var27 = p_Var21;
    }
    goto LAB_0049774c;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_Var21;
  }
  p_Var13 = w[-1].work;
  pcVar24 = p_Var13 + 8;
  uVar20 = 0;
  p_Var25 = p_Var21;
  do {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar24;
    if (p_Var25 <= p_Var3 && (long)p_Var3 - (long)p_Var25 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar24 + -8) = p_Var25 + *(ulong *)(pcVar24 + -8);
      *(long *)pcVar24 = (long)p_Var3 - (long)p_Var25;
      break;
    }
    uVar20 = uVar20 + 1;
    pcVar24 = pcVar24 + 0x10;
    p_Var25 = p_Var25 + -(long)p_Var3;
  } while (p_Var25 != (_func_void_uv__work_ptr_int *)0x0);
  *(uint *)((long)w[-2].wq + 0xc) = uVar20;
  w[-1].work = p_Var13 + (ulong)uVar20 * 0x10;
  p_Var27 = p_Var27 + (long)p_Var21;
  uVar10 = uVar10 - uVar20;
  if (uVar10 == 0) goto LAB_0049774c;
  goto LAB_00496e27;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}